

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer-backend-egl.c
# Opt level: O3

wpe_renderer_backend_egl * wpe_renderer_backend_egl_create(int host_fd)

{
  wpe_renderer_backend_egl *__ptr;
  wpe_renderer_backend_egl_interface *pwVar1;
  void *pvVar2;
  
  __ptr = (wpe_renderer_backend_egl *)calloc(1,0x10);
  if (__ptr != (wpe_renderer_backend_egl *)0x0) {
    pwVar1 = (wpe_renderer_backend_egl_interface *)
             wpe_load_object("_wpe_renderer_backend_egl_interface");
    (__ptr->base).interface = pwVar1;
    if (pwVar1 == (wpe_renderer_backend_egl_interface *)0x0) {
      free(__ptr);
      __ptr = (wpe_renderer_backend_egl *)0x0;
    }
    else {
      pvVar2 = (*pwVar1->create)(host_fd);
      (__ptr->base).interface_data = pvVar2;
    }
    return __ptr;
  }
  wpe_alloc_fail("/workspace/llm4binary/github/license_c_cmakelists/WebPlatformForEmbedded[P]libwpe/src/renderer-backend-egl.c"
                 ,0x24,0x10);
}

Assistant:

struct wpe_renderer_backend_egl*
wpe_renderer_backend_egl_create(int host_fd)
{
    struct wpe_renderer_backend_egl* backend = wpe_calloc(1, sizeof(struct wpe_renderer_backend_egl));

    backend->base.interface = wpe_load_object("_wpe_renderer_backend_egl_interface");
    if (!backend->base.interface) {
        wpe_free(backend);
        return 0;
    }

    backend->base.interface_data = backend->base.interface->create(host_fd);

    return backend;
}